

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O3

Status __thiscall soplex::SPxSolverBase<double>::status(SPxSolverBase<double> *this)

{
  Status SVar1;
  uint uVar2;
  
  SVar1 = this->m_status;
  uVar2 = SVar1 + 0xf;
  if (0x10 < uVar2) {
    return ERROR;
  }
  if ((0x16f9fU >> (uVar2 & 0x1f) & 1) == 0) {
    if (uVar2 != 0xf) {
      return ERROR;
    }
    uVar2 = (this->super_SPxBasisBase<double>).thestatus + PRIMAL;
    SVar1 = ERROR;
    if (uVar2 < 8) {
      return *(Status *)(&DAT_0060ef78 + (ulong)uVar2 * 4);
    }
  }
  return SVar1;
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::status() const
{
   switch(m_status)
   {
   case UNKNOWN :
      switch(SPxBasisBase<R>::status())
      {
      case SPxBasisBase<R>::NO_PROBLEM :
         return NO_PROBLEM;

      case SPxBasisBase<R>::SINGULAR :
         return SINGULAR;

      case SPxBasisBase<R>::REGULAR :
      case SPxBasisBase<R>::DUAL :
      case SPxBasisBase<R>::PRIMAL :
         return UNKNOWN;

      case SPxBasisBase<R>::OPTIMAL :
         return OPTIMAL;

      case SPxBasisBase<R>::UNBOUNDED :
         return UNBOUNDED;

      case SPxBasisBase<R>::INFEASIBLE :
         return INFEASIBLE;

      default:
         return ERROR;
      }

   case SINGULAR :
      return m_status;

   case OPTIMAL :
      assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::OPTIMAL);

   /*lint -fallthrough*/
   case ABORT_CYCLING :
   case ABORT_TIME :
   case ABORT_ITER :
   case ABORT_VALUE :
   case RUNNING :
   case REGULAR :
   case NOT_INIT :
   case NO_SOLVER :
   case NO_PRICER :
   case NO_RATIOTESTER :
   case ERROR:
      return m_status;

   default:
      return ERROR;
   }
}